

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  rep current_time;
  duration<long,_std::ratio<1L,_1000000L>_> local_f0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  duration cur_time;
  undefined1 auStack_d0 [4];
  int activity;
  timeval tv;
  fd_set *__arr;
  int local_b0;
  uint __i;
  undefined1 local_a8 [4];
  int max_fd;
  fd_set fds;
  undefined4 local_20;
  int iStack_1c;
  bool flag_main_cycle;
  int broadcastEnable;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _broadcastEnable = argv;
  argv_local._0_4_ = argc;
  signal(2,on_signal_close);
  signal(0xf,on_signal_close);
  init_globals();
  iStack_1c = 0;
  while (iStack_1c = getopt((int)argv_local,_broadcastEnable,"p:l:m:"), iStack_1c != -1) {
    if (iStack_1c == 0x6c) {
      precent_lose = atoi(_optarg);
    }
    else if (iStack_1c == 0x6d) {
      iVar2 = atoi(_optarg);
      my_port = (unsigned_short)iVar2;
    }
    else {
      if (iStack_1c != 0x70) {
        fprintf(_stderr,"Unknown argument\n");
        exit(1);
      }
      fprintf(_stderr,"CCCCCCCCCCCCCCCCCCCCCCCC\n");
      flag_root = false;
      parse_parent_address(_optarg);
    }
  }
  if (my_port == 0) {
    fprintf(_stderr,"No port\n");
    exit(1);
  }
  fprintf(_stderr,"AAAAAAAAAAAAAAAAAAAAAAAAA\n");
  socket_fd = socket(2,2,0);
  local_20 = 1;
  setsockopt(socket_fd,1,6,&local_20,4);
  bzero(&my_addr,0x10);
  my_addr.sin_family = 2;
  my_addr.sin_port = htons(my_port);
  my_addr.sin_addr.s_addr = htonl(0);
  iVar2 = bind(socket_fd,(sockaddr *)&my_addr,0x10);
  if (-1 < iVar2) {
    do_express_myself();
    fds.fds_bits[0xf]._7_1_ = 1;
    while ((fds.fds_bits[0xf]._7_1_ & 1) != 0) {
      local_b0 = fileno(_stdin);
      puVar4 = (uint *)std::max<int>(&local_b0,&socket_fd);
      __i = *puVar4;
      tv.tv_usec = (__suseconds_t)local_a8;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(tv.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
      }
      *(ulong *)(local_a8 + (long)(socket_fd / 0x40) * 8) =
           1L << ((byte)((long)socket_fd % 0x40) & 0x3f) |
           *(ulong *)(local_a8 + (long)(socket_fd / 0x40) * 8);
      iVar2 = fileno(_stdin);
      iVar3 = fileno(_stdin);
      *(ulong *)(local_a8 + (long)(iVar3 / 0x40) * 8) =
           1L << ((byte)((long)iVar2 % 0x40) & 0x3f) |
           *(ulong *)(local_a8 + (long)(iVar3 / 0x40) * 8);
      _auStack_d0 = 0;
      tv.tv_sec = 500000;
      cur_time.__r._4_4_ =
           select(__i + 1,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_d0);
      if (-1 < cur_time.__r._4_4_) {
        local_e8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_e0.__r = (rep)std::chrono::
                            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ::time_since_epoch(&local_e8);
        local_f0.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                      (&local_e0);
        current_time = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_f0);
        check_and_resend(current_time);
        iVar2 = fileno(_stdin);
        uVar1 = *(ulong *)(local_a8 + (long)(iVar2 / 0x40) * 8);
        iVar2 = fileno(_stdin);
        if ((uVar1 & 1L << ((byte)((long)iVar2 % 0x40) & 0x3f)) != 0) {
          read_message_from_console();
        }
        if ((*(ulong *)(local_a8 + (long)(socket_fd / 0x40) * 8) &
            1L << ((byte)((long)socket_fd % 0x40) & 0x3f)) != 0) {
          recv_message();
        }
      }
    }
    final_function();
    return 0;
  }
  perror("Bind");
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
    signal(SIGINT, on_signal_close);
    signal(SIGTERM, on_signal_close);

    init_globals();

    int opt = 0;
    while ((opt = getopt(argc, argv, "p:l:m:")) != -1) {
        switch (opt) {
            case 'p':
                fprintf(stderr, "CCCCCCCCCCCCCCCCCCCCCCCC\n");
                flag_root = false;
                parse_parent_address(optarg);
                break;
            case 'l':
                precent_lose = atoi(optarg);
                break;
            case 'm':
                my_port = (unsigned short)atoi(optarg);
                break;
            default:
                fprintf(stderr, "Unknown argument\n");
                exit(EXIT_FAILURE);
        }
    }
    if (!my_port) {
        fprintf(stderr, "No port\n");
        exit(EXIT_FAILURE);
    }
    fprintf(stderr, "AAAAAAAAAAAAAAAAAAAAAAAAA\n");

    socket_fd = socket(PF_INET, SOCK_DGRAM, 0);
    int broadcastEnable = 1;
    setsockopt(socket_fd, SOL_SOCKET, SO_BROADCAST, &broadcastEnable, sizeof(broadcastEnable));
    bzero(&my_addr, sizeof(struct sockaddr_in));
    my_addr.sin_family = PF_INET;
    my_addr.sin_port = htons(my_port);
    my_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    if (bind(socket_fd, (struct sockaddr *)&my_addr, sizeof(struct sockaddr_in)) < 0) {
        perror("Bind");
        exit(EXIT_FAILURE);
    }

    do_express_myself();

    bool flag_main_cycle = true;
    while (flag_main_cycle) {
        fd_set fds;
        int max_fd = std::max(fileno(stdin), socket_fd);
        FD_ZERO(&fds);
        FD_SET(socket_fd, &fds);
        FD_SET(fileno(stdin), &fds);

        struct timeval tv = {0, SENDING_INTERVAL / 2};
        int activity = select(max_fd + 1, &fds, 0, 0, &tv);
        if (activity < 0) {
            continue;
        }
        /*if (activity) {
            fprintf(stderr, "Activity: %d\n", activity);
        }*/

        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        check_and_resend(std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count());

        if (FD_ISSET(fileno(stdin), &fds)) {
            read_message_from_console();
        }

        if (FD_ISSET(socket_fd, &fds)) {
            //fprintf(stderr, "!!! On socket\n");
            recv_message();
        }
        //recv_message();
    }

    final_function();
    return 0;
}